

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void state_CND(Context *ctx)

{
  byte bVar1;
  char *pcVar2;
  
  if (ctx->major_ver < 2) {
    bVar1 = 0;
    if (ctx->minor_ver != 0xff) {
      bVar1 = ctx->minor_ver;
    }
    if ((0x10003 < ((uint)bVar1 | (uint)ctx->major_ver << 0x10)) ||
       (((pcVar2 = "CND src must be r0.a in this shader model",
         ctx->source_args[0].regtype == REG_TYPE_TEMP && (ctx->source_args[0].regnum == 0)) &&
        (ctx->source_args[0].swizzle == 0xff)))) {
      return;
    }
  }
  else {
    pcVar2 = "CND not allowed in this shader model";
  }
  failf(ctx,"%s",pcVar2);
  return;
}

Assistant:

static void state_CND(Context *ctx)
{
    // apparently it was removed...it's not in the docs past ps_1_4 ...
    if (shader_version_atleast(ctx, 2, 0))
        fail(ctx, "CND not allowed in this shader model");

    // extra limitations for ps <= 1.4 ...
    else if (!shader_version_atleast(ctx, 1, 4))
    {
        const SourceArgInfo *src = &ctx->source_args[0];
        if ((src->regtype != REG_TYPE_TEMP) || (src->regnum != 0) ||
            (src->swizzle != 0xFF))
        {
            fail(ctx, "CND src must be r0.a in this shader model");
        } // if
    } // if
}